

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O2

void __thiscall
iDynTree::XMLAttribute::XMLAttribute
          (XMLAttribute *this,string *name,string *value,string *prefix,string *uri)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_value,(string *)value);
  std::__cxx11::string::string((string *)&this->m_prefix,(string *)prefix);
  std::__cxx11::string::string((string *)&this->m_uri,(string *)uri);
  return;
}

Assistant:

XMLAttribute::XMLAttribute(std::string name, std::string value, std::string prefix, std::string uri)
    : m_name(name)
    , m_value(value)
    , m_prefix(prefix)
    , m_uri(uri) {}